

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

int Abc_CommandBmsPs(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  char *format;
  
  Extra_UtilGetoptReset();
  iVar1 = Extra_UtilGetopt(argc,argv,"h");
  if (iVar1 == -1) {
    iVar1 = Abc_ExactIsRunning();
    if (iVar1 != 0) {
      Abc_ExactStats();
      return 0;
    }
    format = "BMS manager is not started.";
    iVar1 = -1;
  }
  else {
    Abc_Print(-2,"usage: bms_ps [-h]\n");
    Abc_Print(-2,"\t           shows statistics about BMS manager\n");
    Abc_Print(-2,"\t-h       : print the command usage\n");
    Abc_Print(-2,"\t\n");
    Abc_Print(-2,
              "\t           This command was contributed by Mathias Soeken from EPFL in July 2016.\n"
             );
    format = "\t           The author can be contacted as mathias.soeken at epfl.ch\n";
    iVar1 = -2;
  }
  Abc_Print(iVar1,format);
  return 1;
}

Assistant:

int Abc_CommandBmsPs( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern int Abc_ExactIsRunning();
    extern void Abc_ExactStats();

    int c;

    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "h" ) ) != EOF )
    {
        switch ( c )
        {
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    if ( !Abc_ExactIsRunning() )
    {
        Abc_Print( -1, "BMS manager is not started." );
        return 1;
    }

    Abc_ExactStats();
    return 0;

usage:
    Abc_Print( -2, "usage: bms_ps [-h]\n" );
    Abc_Print( -2, "\t           shows statistics about BMS manager\n" );
    Abc_Print( -2, "\t-h       : print the command usage\n" );
    Abc_Print( -2, "\t\n" );
    Abc_Print( -2, "\t           This command was contributed by Mathias Soeken from EPFL in July 2016.\n" );
    Abc_Print( -2, "\t           The author can be contacted as mathias.soeken at epfl.ch\n" );
    return 1;
}